

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> *
vkt::tessellation::anon_unknown_0::InvariantOuterEdge::generateRandomPatchTessLevels
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,int numPatches,
          int constantOuterLevelIndex,float constantOuterLevel,Random *rnd)

{
  reference pvVar1;
  reference pvVar2;
  float fVar3;
  value_type local_80;
  int local_58;
  int local_54;
  int j_1;
  int j;
  float *outer;
  float *inner;
  int patchNdx;
  allocator<float> local_2a;
  undefined1 local_29;
  Random *local_28;
  Random *rnd_local;
  int local_18;
  float constantOuterLevel_local;
  int constantOuterLevelIndex_local;
  int numPatches_local;
  vector<float,_std::allocator<float>_> *tessLevels;
  
  local_29 = 0;
  local_28 = rnd;
  rnd_local._4_4_ = constantOuterLevel;
  local_18 = constantOuterLevelIndex;
  constantOuterLevel_local = (float)numPatches;
  _constantOuterLevelIndex_local = __return_storage_ptr__;
  std::allocator<float>::allocator(&local_2a);
  std::vector<float,_std::allocator<float>_>::vector
            (__return_storage_ptr__,(long)(numPatches * 6),&local_2a);
  std::allocator<float>::~allocator(&local_2a);
  for (inner._0_4_ = 0; (int)inner < (int)constantOuterLevel_local; inner._0_4_ = (int)inner + 1) {
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       (__return_storage_ptr__,(long)((int)inner * 6));
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (__return_storage_ptr__,(long)((int)inner * 6 + 2));
    for (local_54 = 0; local_54 < 2; local_54 = local_54 + 1) {
      fVar3 = de::Random::getFloat(local_28,1.0,62.0);
      pvVar1[local_54] = fVar3;
    }
    for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
      if (local_58 == local_18) {
        local_80 = rnd_local._4_4_;
      }
      else {
        local_80 = de::Random::getFloat(local_28,1.0,62.0);
      }
      pvVar2[local_58] = local_80;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> generateRandomPatchTessLevels (const int numPatches, const int constantOuterLevelIndex, const float constantOuterLevel, de::Random& rnd)
{
	std::vector<float> tessLevels(numPatches*NUM_TESS_LEVELS);

	for (int patchNdx = 0; patchNdx < numPatches; ++patchNdx)
	{
		float* const inner = &tessLevels[patchNdx*NUM_TESS_LEVELS + 0];
		float* const outer = &tessLevels[patchNdx*NUM_TESS_LEVELS + 2];

		for (int j = 0; j < 2; ++j)
			inner[j] = rnd.getFloat(1.0f, 62.0f);
		for (int j = 0; j < 4; ++j)
			outer[j] = j == constantOuterLevelIndex ? constantOuterLevel : rnd.getFloat(1.0f, 62.0f);
	}

	return tessLevels;
}